

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O3

void av1_calc_indices_dim2_c
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *dist,int n,int k)

{
  bool bVar1;
  int dist_2;
  int iVar2;
  ulong uVar3;
  int dist_1;
  int iVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  
  if (dist != (int64_t *)0x0) {
    *dist = 0;
  }
  if (0 < n) {
    uVar3 = 0;
    do {
      uVar7 = 0;
      iVar4 = 0;
      bVar1 = true;
      do {
        bVar5 = bVar1;
        iVar4 = iVar4 + ((int)data[uVar3 * 2 + uVar7] - (int)centroids[uVar7]) *
                        ((int)data[uVar3 * 2 + uVar7] - (int)centroids[uVar7]);
        uVar7 = 1;
        bVar1 = false;
      } while (bVar5);
      indices[uVar3] = '\0';
      if (1 < k) {
        do {
          lVar6 = 0;
          iVar2 = 0;
          bVar1 = true;
          do {
            bVar5 = bVar1;
            iVar2 = iVar2 + ((int)data[uVar3 * 2 + lVar6] - (int)centroids[uVar7 * 2 + lVar6]) *
                            ((int)data[uVar3 * 2 + lVar6] - (int)centroids[uVar7 * 2 + lVar6]);
            lVar6 = 1;
            bVar1 = false;
          } while (bVar5);
          if (iVar2 < iVar4) {
            indices[uVar3] = (uint8_t)uVar7;
            iVar4 = iVar2;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)k);
      }
      if (dist != (int64_t *)0x0) {
        *dist = *dist + (long)iVar4;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  }
  return;
}

Assistant:

void RENAME_C(av1_calc_indices)(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *dist, int n, int k) {
  if (dist) {
    *dist = 0;
  }
  for (int i = 0; i < n; ++i) {
    int min_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM, centroids);
    indices[i] = 0;
    for (int j = 1; j < k; ++j) {
      const int this_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM,
                                              centroids + j * AV1_K_MEANS_DIM);
      if (this_dist < min_dist) {
        min_dist = this_dist;
        indices[i] = j;
      }
    }
    if (dist) {
#if AV1_K_MEANS_DIM == 1
      *dist += min_dist * min_dist;
#else
      *dist += min_dist;
#endif
    }
  }
}